

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_seq_blck(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  size_t l;
  size_t b;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr pattern_04;
  ro_substr pattern_05;
  ro_substr pattern_06;
  ro_substr pattern_07;
  ro_substr chars;
  ro_substr pattern_08;
  csubstr s_00;
  Location loc;
  ro_substr chars_00;
  csubstr rem_00;
  csubstr val;
  csubstr fmt;
  csubstr fmt_00;
  bool bVar6;
  error_flags eVar7;
  int iVar8;
  char *pcVar9;
  Parser *in_RDI;
  Parser *in_stack_000000b8;
  size_t ind;
  csubstr spc;
  size_t skip;
  bool is_quoted;
  csubstr s;
  char msg_4 [35];
  char msg_3 [31];
  char msg_2 [31];
  char msg_1 [31];
  char msg [30];
  csubstr rem;
  size_t pos;
  char msg_5 [66];
  flag_t in_stack_fffffffffffffa18;
  flag_t in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  flag_t in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  Parser *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  char in_stack_fffffffffffffa47;
  undefined7 in_stack_fffffffffffffa48;
  undefined1 in_stack_fffffffffffffa4f;
  size_t in_stack_fffffffffffffa50;
  undefined6 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5e;
  undefined1 in_stack_fffffffffffffa5f;
  Parser *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6c;
  undefined1 in_stack_fffffffffffffa6d;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffa6e;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffa6f;
  Parser *in_stack_fffffffffffffa70;
  size_t *psVar12;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  undefined8 in_stack_fffffffffffffa80;
  csubstr *pcVar13;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  char *in_stack_fffffffffffffa90;
  undefined6 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 in_stack_fffffffffffffa9f;
  size_t in_stack_fffffffffffffaa0;
  basic_substring<const_char> *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  pfn_error p_Var14;
  size_t in_stack_fffffffffffffab8;
  Parser *in_stack_fffffffffffffac0;
  basic_substring<const_char> *this_00;
  undefined7 in_stack_fffffffffffffac8;
  undefined7 uVar15;
  undefined1 in_stack_fffffffffffffacf;
  Parser *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffad8;
  Parser *in_stack_fffffffffffffae0;
  Parser *in_stack_fffffffffffffae8;
  undefined1 *in_stack_fffffffffffffaf8;
  Parser *in_stack_fffffffffffffb00;
  basic_substring<char_const> local_4e0 [16];
  basic_substring<char_const> local_4d0 [16];
  size_t local_4c0;
  basic_substring<char_const> local_4b8 [16];
  size_t in_stack_fffffffffffffb58;
  Parser *in_stack_fffffffffffffb60;
  Parser *local_488;
  Parser *in_stack_fffffffffffffb80;
  basic_substring<char_const> local_470 [16];
  char *local_460;
  char *local_458;
  basic_substring<const_char> local_450;
  basic_substring<char_const> local_440 [16];
  size_t local_430;
  char *local_428;
  basic_substring<char_const> local_420 [16];
  basic_substring<char_const> local_410 [12];
  flag_t in_stack_fffffffffffffbfc;
  size_t in_stack_fffffffffffffc10;
  basic_substring<char_const> local_3e0 [16];
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  basic_substring<const_char> local_3b0;
  basic_substring<char_const> local_3a0 [8];
  Parser *in_stack_fffffffffffffc68;
  basic_substring<char_const> local_380 [16];
  basic_substring<char_const> local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  Parser *local_340;
  undefined1 local_338 [40];
  ro_substr local_310;
  basic_substring<char_const> local_300 [16];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  Parser *local_2d0;
  char local_2c8 [24];
  undefined4 in_stack_fffffffffffffd50;
  undefined2 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  csubstr *in_stack_fffffffffffffd58;
  Parser *in_stack_fffffffffffffd60;
  undefined7 local_290;
  undefined1 in_stack_fffffffffffffd77;
  Parser *in_stack_fffffffffffffd78;
  undefined8 local_280;
  Parser *in_stack_fffffffffffffd88;
  Parser *local_270;
  undefined1 local_268 [63];
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  Parser *local_220;
  char *local_218;
  undefined1 local_210;
  undefined1 uStack_20f;
  undefined1 uStack_20e;
  undefined1 uStack_20d;
  undefined1 uStack_20c;
  undefined1 uStack_20b;
  undefined1 uStack_20a;
  undefined1 uStack_209;
  undefined1 local_208;
  undefined1 uStack_207;
  undefined1 uStack_206;
  undefined1 uStack_205;
  undefined1 uStack_204;
  undefined1 uStack_203;
  undefined1 uStack_202;
  undefined1 uStack_201;
  undefined4 local_200;
  undefined2 local_1fc;
  undefined1 local_1fa;
  size_t local_1f0;
  char *pcStack_1e8;
  size_t local_1e0;
  char *pcStack_1d8;
  Parser *local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined1 uStack_1bf;
  undefined1 uStack_1be;
  undefined1 uStack_1bd;
  undefined1 uStack_1bc;
  undefined1 uStack_1bb;
  undefined1 uStack_1ba;
  undefined1 uStack_1b9;
  char *local_1b8;
  undefined4 local_1b0;
  undefined2 local_1ac;
  undefined1 local_1a8 [64];
  char *local_168;
  undefined4 local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 local_131;
  char *local_130;
  undefined1 local_121;
  Parser *in_stack_fffffffffffffee0;
  Parser *this_01;
  char *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  size_t local_c8;
  char *local_c0;
  basic_substring<char_const> local_a8 [16];
  char *local_98;
  char *local_90;
  char *pcStack_88;
  char *local_80;
  size_t sStack_78;
  char *local_70;
  char local_68 [72];
  ro_substr local_20;
  char (*local_10) [3];
  
  local_1a8._0_8_ = (in_RDI->m_state->line_contents).rem.str;
  local_1a8._8_8_ = (in_RDI->m_state->line_contents).rem.len;
  bVar6 = has_all(in_RDI,8);
  if (!bVar6) {
    local_1c8 = (char *)0x6166206b63656863;
    local_1c0 = 'i';
    uStack_1bf = 'l';
    uStack_1be = 'e';
    uStack_1bd = 'd';
    uStack_1bc = ':';
    uStack_1bb = ' ';
    uStack_1ba = '(';
    uStack_1b9 = 'h';
    local_1b8 = (char *)0x52286c6c615f7361;
    local_1b0 = 0x29514553;
    local_1ac = 0x29;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                       (char *)in_stack_fffffffffffffa38,
                       CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                       CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                       CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    in_stack_fffffffffffffa28 = (flag_t)local_1e0;
    in_stack_fffffffffffffa2c = (undefined4)(local_1e0 >> 0x20);
    in_stack_fffffffffffffa30 = SUB84(pcStack_1d8,0);
    in_stack_fffffffffffffa34 = (undefined4)((ulong)pcStack_1d8 >> 0x20);
    in_stack_fffffffffffffa18 = (flag_t)local_1f0;
    in_stack_fffffffffffffa1c = (flag_t)(local_1f0 >> 0x20);
    in_stack_fffffffffffffa20 = SUB84(pcStack_1e8,0);
    in_stack_fffffffffffffa24 = (undefined4)((ulong)pcStack_1e8 >> 0x20);
    LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffffa20;
    LVar1.super_LineCol.offset = local_1f0;
    LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffffa24;
    LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffffa28;
    LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffffa2c;
    LVar1.name.str._0_4_ = in_stack_fffffffffffffa30;
    LVar1.name.str._4_4_ = in_stack_fffffffffffffa34;
    LVar1.name.len = (size_t)local_1d0;
    (*p_Var14)((char *)&stack0xfffffffffffffe38,0x1e,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data
              );
    in_stack_fffffffffffffa38 = local_1d0;
  }
  bVar6 = has_none(in_RDI,0x40);
  if (!bVar6) {
    local_218 = (char *)0x6166206b63656863;
    local_210 = 'i';
    uStack_20f = 'l';
    uStack_20e = 'e';
    uStack_20d = 'd';
    uStack_20c = ':';
    uStack_20b = ' ';
    uStack_20a = '(';
    uStack_209 = 'h';
    local_208 = 'a';
    uStack_207 = 's';
    uStack_206 = '_';
    uStack_205 = 'n';
    uStack_204 = 'o';
    uStack_203 = 'n';
    uStack_202 = 'e';
    uStack_201 = '(';
    local_200 = 0x59454b52;
    local_1fc = 0x2929;
    local_1fa = 0;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    in_stack_fffffffffffffb00 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffaf8 = (undefined1 *)&stack0xfffffffffffffde8;
    b = CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30);
    l = CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa2c = stack0xfffffffffffffdd4;
    in_stack_fffffffffffffa30 = in_stack_fffffffffffffdd8;
    in_stack_fffffffffffffa34 = in_stack_fffffffffffffddc;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                       (char *)in_stack_fffffffffffffa38,b,l,
                       CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    unique0x10002ce8 = in_stack_fffffffffffffa2c;
    in_stack_fffffffffffffdd8 = in_stack_fffffffffffffa30;
    in_stack_fffffffffffffddc = in_stack_fffffffffffffa34;
    (*(code *)in_stack_fffffffffffffb00)
              (in_stack_fffffffffffffaf8,0x1f,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa18 = local_268._40_4_;
    in_stack_fffffffffffffa1c = local_268._44_4_;
    in_stack_fffffffffffffa20 = local_268._48_4_;
    in_stack_fffffffffffffa24 = local_268._52_4_;
    in_stack_fffffffffffffa28 = local_268._56_4_;
    in_stack_fffffffffffffa38 = local_220;
  }
  uVar10 = SUB41(stack0xfffffffffffffdd4,3);
  bVar6 = has_none(in_RDI,0x10);
  if (!bVar6) {
    local_268[0] = 'c';
    local_268[1] = 'h';
    local_268[2] = 'e';
    local_268[3] = 'c';
    local_268[4] = 'k';
    local_268[5] = ' ';
    local_268[6] = 'f';
    local_268[7] = 'a';
    local_268[8] = 'i';
    local_268[9] = 'l';
    local_268[10] = 'e';
    local_268[0xb] = 'd';
    local_268[0xc] = ':';
    local_268[0xd] = ' ';
    local_268[0xe] = '(';
    local_268[0xf] = 'h';
    local_268[0x10] = 'a';
    local_268[0x11] = 's';
    local_268[0x12] = '_';
    local_268[0x13] = 'n';
    local_268[0x14] = 'o';
    local_268[0x15] = 'n';
    local_268[0x16] = 'e';
    local_268[0x17] = '(';
    local_268._24_4_ = 0x574f4c46;
    local_268._28_2_ = 0x2929;
    local_268[0x1e] = 0;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffae8 = (Parser *)local_268;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                       (char *)in_stack_fffffffffffffa38,
                       CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                       CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                       CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    in_stack_fffffffffffffa28 = (flag_t)local_280;
    in_stack_fffffffffffffa2c = (undefined4)((ulong)local_280 >> 0x20);
    in_stack_fffffffffffffa30 = SUB84(in_stack_fffffffffffffd88,0);
    in_stack_fffffffffffffa34 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    in_stack_fffffffffffffa18 = (flag_t)local_290;
    in_stack_fffffffffffffa1c = (flag_t)(CONCAT17(in_stack_fffffffffffffd77,local_290) >> 0x20);
    in_stack_fffffffffffffa20 = SUB84(in_stack_fffffffffffffd78,0);
    in_stack_fffffffffffffa24 = (undefined4)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    LVar2.super_LineCol.offset._4_4_ = in_stack_fffffffffffffa1c;
    LVar2.super_LineCol.offset._0_4_ = in_stack_fffffffffffffa18;
    LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffffa20;
    LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffffa24;
    LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffffa28;
    LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffffa2c;
    LVar2.name.str._0_4_ = in_stack_fffffffffffffa30;
    LVar2.name.str._4_4_ = in_stack_fffffffffffffa34;
    LVar2.name.len = (size_t)local_270;
    (*p_Var14)((char *)in_stack_fffffffffffffae8,0x1f,LVar2,
               (in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa38 = local_270;
  }
  bVar6 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_1a8,'#');
  if (bVar6) {
    _scan_comment(in_stack_fffffffffffffae8);
    return true;
  }
  bVar6 = has_any(in_RDI,0x100);
  if (bVar6) {
    bVar6 = has_none(in_RDI,0x80);
    if (!bVar6) {
      builtin_strncpy(local_2c8,"check failed: (has_none(",0x18);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
      pcVar9 = local_2c8;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                         (char *)in_stack_fffffffffffffa38,
                         CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                         CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                         CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      in_stack_fffffffffffffa28 = (flag_t)local_2e0;
      in_stack_fffffffffffffa2c = (undefined4)((ulong)local_2e0 >> 0x20);
      in_stack_fffffffffffffa30 = (undefined4)uStack_2d8;
      in_stack_fffffffffffffa34 = (undefined4)((ulong)uStack_2d8 >> 0x20);
      in_stack_fffffffffffffa18 = (flag_t)local_2f0;
      in_stack_fffffffffffffa1c = (flag_t)((ulong)local_2f0 >> 0x20);
      in_stack_fffffffffffffa20 = (undefined4)uStack_2e8;
      in_stack_fffffffffffffa24 = (undefined4)((ulong)uStack_2e8 >> 0x20);
      LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffffa20;
      LVar3.super_LineCol.offset = local_2f0;
      LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffffa24;
      LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffffa28;
      LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffffa2c;
      LVar3.name.str._0_4_ = in_stack_fffffffffffffa30;
      LVar3.name.str._4_4_ = in_stack_fffffffffffffa34;
      LVar3.name.len = (size_t)local_2d0;
      (*p_Var14)(pcVar9,0x1f,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffa38 = local_2d0;
    }
    bVar6 = _handle_indentation(in_stack_fffffffffffffd88);
    if (bVar6) {
      return true;
    }
    basic_substring<char_const>::basic_substring<3ul>(local_300,(char (*) [3])0x35d640);
    pattern.str._7_1_ = in_stack_fffffffffffffa47;
    pattern.str._0_7_ = in_stack_fffffffffffffa40;
    pattern.len._0_7_ = in_stack_fffffffffffffa48;
    pattern.len._7_1_ = in_stack_fffffffffffffa4f;
    bVar6 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern);
    if (bVar6) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    this_01 = (Parser *)local_1a8;
    local_121 = 0x2d;
    iVar8 = basic_substring<const_char>::compare
                      ((basic_substring<const_char> *)in_stack_fffffffffffffa38,
                       (char)((uint)in_stack_fffffffffffffa34 >> 0x18));
    if (iVar8 != 0) {
      basic_substring<char_const>::basic_substring<3ul>
                ((basic_substring<char_const> *)&local_310,(char (*) [3])" \t");
      bVar6 = basic_substring<const_char>::begins_with_any
                        ((basic_substring<const_char> *)local_1a8,local_310);
      if (bVar6) {
        bVar6 = _at_line_begin(in_RDI);
        if (bVar6) {
          memcpy(local_338,"check failed: (! _at_line_begin())",0x23);
          eVar7 = get_error_flags();
          if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            trap_instruction();
          }
          p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
          uVar15 = SUB87(local_338,0);
          uVar10 = (undefined1)((ulong)local_338 >> 0x38);
          Location::Location((Location *)
                             CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                             (char *)in_stack_fffffffffffffa38,
                             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                             CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
          in_stack_fffffffffffffa28 = (flag_t)local_350;
          in_stack_fffffffffffffa2c = (undefined4)((ulong)local_350 >> 0x20);
          in_stack_fffffffffffffa30 = (undefined4)uStack_348;
          in_stack_fffffffffffffa34 = (undefined4)((ulong)uStack_348 >> 0x20);
          in_stack_fffffffffffffa20 = (undefined4)uStack_358;
          in_stack_fffffffffffffa24 = (undefined4)((ulong)uStack_358 >> 0x20);
          LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffffa20;
          LVar4.super_LineCol.offset = local_360;
          LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffffa24;
          LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffffa28;
          LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffffa2c;
          LVar4.name.str._0_4_ = in_stack_fffffffffffffa30;
          LVar4.name.str._4_4_ = in_stack_fffffffffffffa34;
          LVar4.name.len = (size_t)local_340;
          (*p_Var14)((char *)CONCAT17(uVar10,uVar15),0x23,LVar4,
                     (in_RDI->m_stack).m_callbacks.m_user_data);
          in_stack_fffffffffffffa38 = local_340;
        }
        local_10 = (char (*) [3])0x349cfb;
        this_00 = &(in_RDI->m_state->line_contents).rem;
        basic_substring<char_const>::basic_substring<3ul>
                  ((basic_substring<char_const> *)&local_20,(char (*) [3])" \t");
        bVar6 = basic_substring<const_char>::begins_with_any(this_00,local_20);
        if (!bVar6) {
          memcpy(local_68,"check failed: (m_state->line_contents.rem.begins_with_any(chars))",0x42);
          eVar7 = get_error_flags();
          if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            trap_instruction();
          }
          p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
          Location::Location((Location *)
                             CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                             (char *)in_stack_fffffffffffffa38,
                             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                             CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
          LVar5.super_LineCol.line._0_4_ = (int)pcStack_88;
          LVar5.super_LineCol.offset = (size_t)local_90;
          LVar5.super_LineCol.line._4_4_ = (int)((ulong)pcStack_88 >> 0x20);
          LVar5.super_LineCol.col._0_4_ = (int)local_80;
          LVar5.super_LineCol.col._4_4_ = (int)((ulong)local_80 >> 0x20);
          LVar5.name.str._0_4_ = (int)sStack_78;
          LVar5.name.str._4_4_ = (int)(sStack_78 >> 0x20);
          LVar5.name.len = (size_t)local_70;
          (*p_Var14)(local_68,0x42,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data);
        }
        basic_substring<char_const>::basic_substring<3ul>(local_a8,local_10);
        chars.len._0_4_ = in_stack_fffffffffffffa68;
        chars.str = (char *)in_stack_fffffffffffffa60;
        chars.len._4_1_ = in_stack_fffffffffffffa6c;
        chars.len._5_1_ = in_stack_fffffffffffffa6d;
        chars.len._6_1_ = in_stack_fffffffffffffa6e;
        chars.len._7_1_ = in_stack_fffffffffffffa6f;
        local_98 = (char *)basic_substring<const_char>::first_not_of
                                     ((basic_substring<const_char> *)
                                      CONCAT17(in_stack_fffffffffffffa5f,
                                               CONCAT16(in_stack_fffffffffffffa5e,
                                                        in_stack_fffffffffffffa58)),chars,
                                      in_stack_fffffffffffffa50);
        if (local_98 == (char *)0xffffffffffffffff) {
          local_98 = (char *)(in_RDI->m_state->line_contents).rem.len;
        }
        _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
        return true;
      }
      basic_substring<char_const>::basic_substring<4ul>(local_370,(char (*) [4])0x343019);
      pattern_00.str._7_1_ = in_stack_fffffffffffffa47;
      pattern_00.str._0_7_ = in_stack_fffffffffffffa40;
      pattern_00.len._0_7_ = in_stack_fffffffffffffa48;
      pattern_00.len._7_1_ = in_stack_fffffffffffffa4f;
      bVar6 = basic_substring<const_char>::begins_with
                        ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_00);
      if (!bVar6) {
        basic_substring<char_const>::basic_substring<4ul>(local_380,(char (*) [4])"---");
        pattern_01.str._7_1_ = in_stack_fffffffffffffa47;
        pattern_01.str._0_7_ = in_stack_fffffffffffffa40;
        pattern_01.len._0_7_ = in_stack_fffffffffffffa48;
        pattern_01.len._7_1_ = in_stack_fffffffffffffa4f;
        bVar6 = basic_substring<const_char>::begins_with
                          ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_01);
        if (!bVar6) {
          bVar6 = is_debugger_attached();
          if ((bVar6) && (bVar6 = is_debugger_attached(), bVar6)) {
            trap_instruction();
          }
          basic_substring<char_const>::basic_substring<19ul>
                    (local_3a0,(char (*) [19])"ERROR: parse error");
          fmt.len._0_4_ = in_stack_fffffffffffffef0;
          fmt.str = in_stack_fffffffffffffee8;
          fmt.len._4_4_ = in_stack_fffffffffffffef4;
          _err<>(this_01,fmt);
          return false;
        }
        rem_00.str._7_1_ = in_stack_fffffffffffffacf;
        rem_00.str._0_7_ = in_stack_fffffffffffffac8;
        rem_00.len = (size_t)in_stack_fffffffffffffad0;
        _start_new_doc(in_stack_fffffffffffffac0,rem_00);
        return true;
      }
      _end_stream(in_stack_fffffffffffffc68);
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
    _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
    return true;
  }
  bVar6 = has_any(in_RDI,0x80);
  if (!bVar6) {
    return false;
  }
  bVar6 = _handle_indentation(in_stack_fffffffffffffd88);
  if (bVar6) {
    return true;
  }
  basic_substring<const_char>::basic_substring(&local_3b0);
  bVar6 = _scan_scalar_seq_blck
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                     (bool *)CONCAT17(in_stack_fffffffffffffd57,
                                      CONCAT16(in_stack_fffffffffffffd56,
                                               CONCAT24(in_stack_fffffffffffffd54,
                                                        in_stack_fffffffffffffd50))));
  if (!bVar6) {
    basic_substring<char_const>::basic_substring<3ul>(local_410,(char (*) [3])0x35d640);
    pattern_03.str._7_1_ = in_stack_fffffffffffffa47;
    pattern_03.str._0_7_ = in_stack_fffffffffffffa40;
    pattern_03.len._0_7_ = in_stack_fffffffffffffa48;
    pattern_03.len._7_1_ = in_stack_fffffffffffffa4f;
    bVar6 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_03);
    if (bVar6) {
      bVar6 = _rval_dash_start_or_continue_seq
                        ((Parser *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
      if (bVar6) {
        _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      }
      return true;
    }
    local_130 = local_1a8;
    local_131 = 0x2d;
    iVar8 = basic_substring<const_char>::compare
                      ((basic_substring<const_char> *)in_stack_fffffffffffffa38,
                       (char)((uint)in_stack_fffffffffffffa34 >> 0x18));
    if (iVar8 == 0) {
      bVar6 = _rval_dash_start_or_continue_seq
                        ((Parser *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
      if (bVar6) {
        _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      }
      return true;
    }
    bVar6 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_1a8,'[');
    if (bVar6) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _push_level(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      _start_seq((Parser *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (bool)uVar10);
      add_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                in_stack_fffffffffffffa1c);
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    bVar6 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_1a8,'{');
    if (bVar6) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _push_level(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      _start_map(in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    basic_substring<char_const>::basic_substring<3ul>(local_420,(char (*) [3])"? ");
    pattern_04.str._7_1_ = in_stack_fffffffffffffa47;
    pattern_04.str._0_7_ = in_stack_fffffffffffffa40;
    pattern_04.len._0_7_ = in_stack_fffffffffffffa48;
    pattern_04.len._7_1_ = in_stack_fffffffffffffa4f;
    bVar6 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_04);
    if (bVar6) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _push_level(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      _start_map(in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _save_indentation(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    bVar6 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_1a8,' ');
    if (bVar6) {
      pcVar9 = (char *)basic_substring<const_char>::first_not_of
                                 ((basic_substring<const_char> *)
                                  CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                                  in_stack_fffffffffffffa47,(size_t)in_stack_fffffffffffffa38);
      psVar12 = (size_t *)local_1a8;
      if ((ulong)local_1a8._8_8_ < pcVar9 && pcVar9 != (char *)0xffffffffffffffff) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        handle_error(0x34984b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
      }
      if (pcVar9 == (char *)0xffffffffffffffff) {
        local_c8 = *psVar12;
        local_c0 = (char *)psVar12[1];
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                   (char *)in_stack_fffffffffffffa38,
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
      }
      local_430 = local_c8;
      local_428 = local_c0;
      bVar6 = _at_line_begin(in_RDI);
      if (bVar6) {
        _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
        return true;
      }
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    bVar6 = _handle_types(in_stack_000000b8);
    if (bVar6) {
      return true;
    }
    bVar6 = _handle_val_anchors_and_refs(in_stack_fffffffffffffb80);
    if (!bVar6) {
      bVar6 = has_all(in_RDI,0x200);
      uVar11 = false;
      uVar10 = uVar11;
      if (!bVar6) {
        basic_substring<char_const>::basic_substring<3ul>(local_440,(char (*) [3])0x34a890);
        pattern_05.str._7_1_ = in_stack_fffffffffffffa47;
        pattern_05.str._0_7_ = in_stack_fffffffffffffa40;
        pattern_05.len._0_7_ = in_stack_fffffffffffffa48;
        pattern_05.len._7_1_ = in_stack_fffffffffffffa4f;
        bVar6 = basic_substring<const_char>::begins_with
                          ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_05);
        uVar10 = true;
        if (!bVar6) {
          basic_substring<char_const>::basic_substring<2ul>(local_470,(char (*) [2])0x35d77b);
          pattern_08.len._0_7_ = in_stack_fffffffffffffa78;
          pattern_08.str = (char *)in_stack_fffffffffffffa70;
          pattern_08.len._7_1_ = in_stack_fffffffffffffa7f;
          pcVar9 = (char *)basic_substring<const_char>::find
                                     ((basic_substring<const_char> *)
                                      CONCAT17(in_stack_fffffffffffffa6f,
                                               CONCAT16(uVar11,CONCAT15(uVar10,CONCAT14(
                                                  in_stack_fffffffffffffa6c,
                                                  in_stack_fffffffffffffa68)))),pattern_08,
                                      (size_t)in_stack_fffffffffffffa60);
          in_stack_fffffffffffffa60 = (Parser *)local_1a8;
          if ((ulong)local_1a8._8_8_ < pcVar9 && pcVar9 != (char *)0xffffffffffffffff) {
            eVar7 = get_error_flags();
            if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
              trap_instruction();
            }
            in_stack_fffffffffffffee8 =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            in_stack_fffffffffffffef0 = 0x1569;
            handle_error(0x34984b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
          }
          if (pcVar9 == (char *)0xffffffffffffffff) {
            local_460 = *(char **)in_stack_fffffffffffffa60;
            local_458 = (in_stack_fffffffffffffa60->m_file).str;
          }
          else {
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)
                       CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                       (char *)in_stack_fffffffffffffa38,
                       CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
            local_460 = in_stack_ffffffffffffff08;
            local_458 = in_stack_ffffffffffffff10;
          }
          basic_substring<char_const>::basic_substring<2ul>
                    ((basic_substring<char_const> *)&stack0xfffffffffffffb80,(char (*) [2])0x35d7dd)
          ;
          chars_00.len = in_stack_fffffffffffffab8;
          chars_00.str = in_stack_fffffffffffffab0;
          local_450 = basic_substring<const_char>::trimr(in_stack_fffffffffffffaa8,chars_00);
          iVar8 = basic_substring<const_char>::compare
                            ((basic_substring<const_char> *)
                             CONCAT17(in_stack_fffffffffffffa9f,
                                      CONCAT16(in_stack_fffffffffffffa9e,in_stack_fffffffffffffa98))
                             ,in_stack_fffffffffffffa90,
                             CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
          uVar10 = iVar8 == 0;
        }
      }
      if ((bool)uVar10 == false) {
        bVar6 = is_debugger_attached();
        if ((bVar6) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        basic_substring<char_const>::basic_substring<19ul>
                  (local_4e0,(char (*) [19])"ERROR: parse error");
        fmt_00.len._0_4_ = in_stack_fffffffffffffef0;
        fmt_00.str = in_stack_fffffffffffffee8;
        fmt_00.len._4_4_ = in_stack_fffffffffffffef4;
        _err<>(in_stack_fffffffffffffee0,fmt_00);
        return false;
      }
      local_1a8._40_8_ = &in_RDI->m_val_anchor;
      bVar6 = true;
      if ((in_RDI->m_val_anchor).len != 0) {
        bVar6 = ((csubstr *)local_1a8._40_8_)->str == (char *)0x0;
      }
      if (bVar6) {
        local_1a8._32_8_ = &in_RDI->m_val_tag;
        in_stack_fffffffffffffa40 = (undefined7)local_1a8._32_8_;
        in_stack_fffffffffffffa47 = (char)((ulong)local_1a8._32_8_ >> 0x38);
        in_stack_fffffffffffffa4f = true;
        if ((in_RDI->m_val_tag).len != 0) {
          in_stack_fffffffffffffa4f = ((csubstr *)local_1a8._32_8_)->str == (char *)0x0;
        }
        if ((bool)in_stack_fffffffffffffa4f != false) {
          addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                       in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
          local_4c0 = in_RDI->m_state->indref;
          _push_level(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
          _start_map(in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
          _store_scalar_null(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
          addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                       in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
          _set_indentation(in_RDI,local_4c0 + 2);
          basic_substring<char_const>::basic_substring<3ul>(local_4d0,(char (*) [3])0x34a890);
          pattern_07.str._7_1_ = in_stack_fffffffffffffa47;
          pattern_07.str._0_7_ = in_stack_fffffffffffffa40;
          pattern_07.len._0_7_ = in_stack_fffffffffffffa48;
          pattern_07.len._7_1_ = in_stack_fffffffffffffa4f;
          basic_substring<const_char>::begins_with
                    ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_07);
          _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
          return true;
        }
      }
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      _move_val_tag_to_key_tag(in_stack_fffffffffffffa38);
      _move_val_anchor_to_key_anchor(in_stack_fffffffffffffa60);
      _push_level(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      _start_map(in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
      _store_scalar_null(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
      bVar6 = _maybe_set_indentation_from_anchor_or_tag(in_stack_fffffffffffffa38);
      if (!bVar6) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        Location::Location((Location *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30)
                           ,(char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
        loc.super_LineCol.line._0_7_ = in_stack_fffffffffffffa88;
        loc.super_LineCol.offset = in_stack_fffffffffffffa80;
        loc.super_LineCol.line._7_1_ = in_stack_fffffffffffffa8f;
        loc.super_LineCol.col = (size_t)in_stack_fffffffffffffa90;
        loc.name.str._0_6_ = in_stack_fffffffffffffa98;
        loc.name.str._6_1_ = in_stack_fffffffffffffa9e;
        loc.name.str._7_1_ = in_stack_fffffffffffffa9f;
        loc.name.len = in_stack_fffffffffffffaa0;
        error<58ul>((char (*) [58])in_stack_fffffffffffffa70,loc);
        in_stack_fffffffffffffa38 = local_488;
      }
      basic_substring<char_const>::basic_substring<3ul>(local_4b8,(char (*) [3])0x34a890);
      pattern_06.str._7_1_ = in_stack_fffffffffffffa47;
      pattern_06.str._0_7_ = in_stack_fffffffffffffa40;
      pattern_06.len._0_7_ = in_stack_fffffffffffffa48;
      pattern_06.len._7_1_ = in_stack_fffffffffffffa4f;
      basic_substring<const_char>::begins_with
                ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_06);
      _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      return true;
    }
    return true;
  }
  local_1a8._0_8_ = (in_RDI->m_state->line_contents).rem.str;
  local_1a8._8_8_ = (in_RDI->m_state->line_contents).rem.len;
  bVar6 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_1a8,' ');
  if (bVar6) {
    local_3c0 = (char *)basic_substring<const_char>::first_not_of
                                  ((basic_substring<const_char> *)
                                   CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                                   in_stack_fffffffffffffa47,(size_t)in_stack_fffffffffffffa38);
    if (local_3c0 == (char *)0xffffffffffffffff) {
      local_3c0 = (char *)local_1a8._8_8_;
    }
    _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
    local_150 = local_1a8;
    local_158 = local_3c0;
    if ((ulong)local_1a8._8_8_ < local_3c0) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      local_168 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_160 = 0x1533;
      handle_error(0x34984b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,
               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
    local_3d0 = local_148;
    local_3c8 = local_140;
    local_1a8._0_8_ = local_148;
    local_1a8._8_8_ = local_140;
  }
  bVar6 = basic_substring<const_char>::begins_with((basic_substring<const_char> *)local_1a8,'#');
  if (bVar6) {
LAB_002f8ad7:
    val.len = in_stack_fffffffffffffc10;
    val.str = (char *)local_3b0.len;
    _append_val((Parser *)local_3b0.str,val,in_stack_fffffffffffffbfc);
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
  }
  else {
    bVar6 = basic_substring<const_char>::ends_with((basic_substring<const_char> *)local_1a8,':');
    if (!bVar6) {
      basic_substring<char_const>::basic_substring<3ul>(local_3e0,(char (*) [3])0x34a890);
      pattern_02.str._7_1_ = in_stack_fffffffffffffa47;
      pattern_02.str._0_7_ = in_stack_fffffffffffffa40;
      pattern_02.len._0_7_ = in_stack_fffffffffffffa48;
      pattern_02.len._7_1_ = in_stack_fffffffffffffa4f;
      bVar6 = basic_substring<const_char>::begins_with
                        ((basic_substring<const_char> *)in_stack_fffffffffffffa38,pattern_02);
      if (!bVar6) goto LAB_002f8ad7;
    }
    local_1a8._56_8_ = &in_RDI->m_key_anchor;
    bVar6 = true;
    if ((in_RDI->m_key_anchor).len != 0) {
      bVar6 = ((csubstr *)local_1a8._56_8_)->str == (char *)0x0;
    }
    if (bVar6) {
      _move_val_anchor_to_key_anchor(in_stack_fffffffffffffa60);
    }
    pcVar13 = &in_RDI->m_key_tag;
    bVar6 = true;
    if ((in_RDI->m_key_tag).len != 0) {
      bVar6 = pcVar13->str == (char *)0x0;
    }
    local_1a8._48_8_ = pcVar13;
    if (bVar6) {
      _move_val_tag_to_key_tag(in_stack_fffffffffffffa38);
    }
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
    _push_level(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
    _start_map(in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
    s_00.str._7_1_ = in_stack_fffffffffffffa7f;
    s_00.str._0_7_ = in_stack_fffffffffffffa78;
    s_00.len = (size_t)pcVar13;
    _store_scalar(in_stack_fffffffffffffa70,s_00,
                  CONCAT13(in_stack_fffffffffffffa6f,
                           CONCAT12(in_stack_fffffffffffffa6e,
                                    CONCAT11(in_stack_fffffffffffffa6d,in_stack_fffffffffffffa6c))))
    ;
    bVar6 = _maybe_set_indentation_from_anchor_or_tag(in_stack_fffffffffffffa38);
    if (!bVar6) {
      _set_indentation(in_RDI,in_RDI->m_state->scalar_col);
    }
    _move_key_tag2_to_key_tag
              ((Parser *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                 in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
    _line_progressed(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
  }
  return true;
}

Assistant:

bool Parser::_handle_seq_blck()
{
    _c4dbgpf("handle_seq_impl: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }
    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        if(_handle_indentation())
            return true;

        if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
            _skipchars(" \t");
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("got document start '---'");
            _start_new_doc(rem);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        // there can be empty values
        if(_handle_indentation())
            return true;

        csubstr s;
        bool is_quoted;
        if(_scan_scalar_seq_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;
            if(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(rem.begins_with_any(" \t"), rem.begins_with(' ')))
            {
                _c4dbgp("skipping whitespace...");
                size_t skip = rem.first_not_of(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(" \t", ' '));
                if(skip == csubstr::npos)
                    skip = rem.len; // maybe the line is just whitespace
                _line_progressed(skip);
                rem = rem.sub(skip);
            }

            _c4dbgpf("rem=[{}]~~~{}~~~", rem.len, rem);
            if(!rem.begins_with('#') && (rem.ends_with(':') || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                if(m_key_anchor.empty())
                    _move_val_anchor_to_key_anchor();
                if(m_key_tag.empty())
                    _move_val_tag_to_key_tag();
                addrem_flags(RNXT, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _start_map();
                _store_scalar(s, is_quoted);
                if( ! _maybe_set_indentation_from_anchor_or_tag())
                {
                    _c4dbgpf("set indentation from scalar: {}", m_state->scalar_col);
                    _set_indentation(m_state->scalar_col); // this is the column where the scalar starts
                }
                _move_key_tag2_to_key_tag();
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending val to current seq");
                _append_val(s, is_quoted);
                addrem_flags(RNXT, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgp("val is a child map + this key is complex");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level();
            _start_map();
            addrem_flags(QMRK|RKEY, RVAL);
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        /* pathological case:
         * - &key : val
         * - &key :
         * - : val
         */
        else if((!has_all(SSCL)) &&
                (rem.begins_with(": ") || rem.left_of(rem.find("#")).trimr("\t") == ":"))
        {
            if(!m_val_anchor.empty() || !m_val_tag.empty())
            {
                _c4dbgp("val is a child map + this key is empty, with anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                _move_val_tag_to_key_tag();
                _move_val_anchor_to_key_anchor();
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                RYML_CHECK(_maybe_set_indentation_from_anchor_or_tag()); // one of them must exist
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
            else
            {
                _c4dbgp("val is a child map + this key is empty, no anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                size_t ind = m_state->indref;
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                _c4dbgpf("set indentation from map anchor: {}", ind + 2);
                _set_indentation(ind + 2); // this is the column where the map starts
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
        }
        else
        {
            _c4err("parse error");
        }
    }

    return false;
}